

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSwit.h
# Opt level: O2

void __thiscall NaPNSwitcher::~NaPNSwitcher(NaPNSwitcher *this)

{
  *(code **)this = __cxa_finalize;
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)(this + 0x120));
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)(this + 0xd8));
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)(this + 0x90));
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)(this + 0x48));
  NaPetriNode::~NaPetriNode((NaPetriNode *)this);
  return;
}

Assistant:

class PNNA_API NaPNSwitcher : public NaPetriNode
{
public:

    // Create node for Petri network
    NaPNSwitcher (const char* szNodeName = "switcher");


    ////////////////
    // Connectors //
    ////////////////

    // Control input
    NaPetriCnInput      turn;

    // Input #1 (mainstream)
    NaPetriCnInput      in1;

    // Input #2
    NaPetriCnInput      in2;

    // Output (mainstream)
    NaPetriCnOutput     out;


    ///////////////////
    // Quick linkage //
    ///////////////////

    // Return mainstream input connector (the only input or NULL)
    virtual NaPetriConnector*   main_input_cn ();


    ///////////////////////
    // Phases of network //
    ///////////////////////

    // 2. Link connectors inside the node
    virtual void        relate_connectors ();

    // 5. Verification to be sure all is OK (true)
    virtual bool        verify ();

    // 7. Do one step of node activity and return true if succeeded
    virtual bool        activate ();

    // 8. True action of the node (if activate returned true)
    virtual void        action ();

    // 9. Finish data processing by the node (if activate returned true)
    virtual void        post_action ();

}